

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  ostream *poVar1;
  int iVar2;
  __pid_t _Var3;
  size_t sVar4;
  int *piVar5;
  UnitTestImpl *pUVar6;
  char *pcVar7;
  allocator local_135;
  int local_134;
  int pipe_fd [2];
  Message msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  sVar4 = GetThreadCount();
  if (sVar4 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_108,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                       ,0x346);
    Message::Message(&msg);
    poVar1 = (ostream *)((long)msg.ss_.ptr_ + 0x10);
    std::operator<<(poVar1,"Death tests use fork(), which is unsafe particularly");
    std::operator<<(poVar1," in a threaded context. For this test, ");
    std::operator<<(poVar1,"Google Test");
    std::operator<<(poVar1," ");
    if (sVar4 == 0) {
      pcVar7 = "couldn\'t detect the number of threads.";
    }
    else {
      std::operator<<(poVar1,"detected ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar7 = " threads.";
    }
    std::operator<<(poVar1,pcVar7);
    StringStreamToString(&local_e8,(stringstream *)msg.ss_.ptr_);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&msg.ss_);
    std::operator<<((ostream *)&std::cerr,(string *)&local_e8);
    std::__cxx11::string::_M_dispose();
    GTestLog::~GTestLog((GTestLog *)&local_108);
  }
  iVar2 = pipe(pipe_fd);
  if (iVar2 == -1) {
    std::__cxx11::string::string((string *)&local_88,"CHECK failed: File ",(allocator *)&local_134);
    std::operator+(&local_68,&local_88,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_48,&local_68,", line ");
    local_c8._M_dataplus._M_p._0_4_ = 0x34a;
    StreamableToString<int>(&local_a8,(int *)&local_c8);
    std::operator+(&local_108,&local_48,&local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                   &local_108,": ");
    pcVar7 = "pipe(pipe_fd) != -1";
  }
  else {
    std::__cxx11::string::string((string *)&local_e8,"",(allocator *)&msg);
    DeathTest::set_last_death_test_message(&local_e8);
    std::__cxx11::string::_M_dispose();
    CaptureStderr();
    FlushInfoLog();
    _Var3 = fork();
    if (_Var3 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var3;
      if (_Var3 == 0) {
        do {
          iVar2 = close(pipe_fd[0]);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pipe_fd[1];
            pUVar6 = GetUnitTestImpl();
            ((pUVar6->listeners_).repeater_)->forwarding_enabled_ = false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        std::__cxx11::string::string((string *)&local_a8,"CHECK failed: File ",&local_135);
        std::operator+(&local_88,&local_a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_68,&local_88,", line ");
        local_134 = 0x35b;
        StreamableToString<int>(&local_c8,&local_134);
        std::operator+(&local_48,&local_68,&local_c8);
        std::operator+(&local_108,&local_48,": ");
        pcVar7 = "close(pipe_fd[0])";
      }
      else {
        do {
          iVar2 = close(pipe_fd[1]);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        std::__cxx11::string::string((string *)&local_a8,"CHECK failed: File ",&local_135);
        std::operator+(&local_88,&local_a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_68,&local_88,", line ");
        local_134 = 0x367;
        StreamableToString<int>(&local_c8,&local_134);
        std::operator+(&local_48,&local_68,&local_c8);
        std::operator+(&local_108,&local_48,": ");
        pcVar7 = "close(pipe_fd[1])";
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                     &local_108,pcVar7);
      std::operator+(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                     " != -1");
      DeathTestAbort(&local_e8);
    }
    std::__cxx11::string::string((string *)&local_88,"CHECK failed: File ",(allocator *)&local_134);
    std::operator+(&local_68,&local_88,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/third_party/gtest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_48,&local_68,", line ");
    local_c8._M_dataplus._M_p._0_4_ = 0x358;
    StreamableToString<int>(&local_a8,(int *)&local_c8);
    std::operator+(&local_108,&local_48,&local_a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                   &local_108,": ");
    pcVar7 = "child_pid != -1";
  }
  std::operator+(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg
                 ,pcVar7);
  DeathTestAbort(&local_e8);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}